

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indiancal.cpp
# Opt level: O2

int32_t __thiscall
icu_63::IndianCalendar::handleComputeMonthStart
          (IndianCalendar *this,int32_t eyear,int32_t month,UBool param_3)

{
  UBool UVar1;
  int32_t iVar2;
  int iVar3;
  double dVar4;
  int32_t month_local;
  
  month_local = month;
  if (0xb < (uint)month) {
    iVar2 = ClockMath::floorDivide((double)month,0xc,&month_local);
    eyear = eyear + iVar2;
  }
  iVar2 = month_local;
  UVar1 = isGregorianLeap(eyear + 0x4e);
  dVar4 = gregorianToJD(eyear + 0x4e,3,(UVar1 == '\0') + 0x15);
  if ((iVar2 == 0xc) || (iVar2 == 0)) {
    dVar4 = dVar4 + 0.0;
  }
  else {
    iVar3 = 7;
    if (iVar2 + 1 < 7) {
      iVar3 = iVar2 + 1;
    }
    dVar4 = (double)(iVar3 * 0x1f + -0x3e) +
            dVar4 + *(double *)(&DAT_002e2090 + (ulong)(UVar1 == '\0') * 8);
    if (6 < iVar2) {
      dVar4 = dVar4 + (double)(iVar2 * 0x1e + -0xb4);
    }
  }
  return (int)dVar4;
}

Assistant:

int32_t IndianCalendar::handleComputeMonthStart(int32_t eyear, int32_t month, UBool /* useMonth */ ) const {

   //month is 0 based; converting it to 1-based 
   int32_t imonth;

    // If the month is out of range, adjust it into range, and adjust the extended eyar accordingly
   if (month < 0 || month > 11) {
      eyear += (int32_t)ClockMath::floorDivide(month, 12, month);
   }

   if(month == 12){
       imonth = 1;
   } else {
       imonth = month + 1; 
   }
   
   double jd = IndianToJD(eyear ,imonth, 1);

   return (int32_t)jd;
}